

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

int ShFinalize(void)

{
  TSymbolTable *pTVar1;
  TPoolAllocator *pTVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long lVar11;
  bool bVar12;
  int p;
  long lVar13;
  bool bVar14;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::init_lock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  iVar3 = (anonymous_namespace)::NumberOfClients + -1;
  if (0 < (anonymous_namespace)::NumberOfClients) {
    bVar14 = (anonymous_namespace)::NumberOfClients == 1;
    (anonymous_namespace)::NumberOfClients = iVar3;
    if (bVar14) {
      puVar4 = &(anonymous_namespace)::SharedSymbolTables;
      lVar7 = 0;
      do {
        lVar6 = 0;
        puVar9 = puVar4;
        do {
          lVar13 = 0;
          puVar10 = puVar9;
          do {
            lVar5 = 0;
            bVar14 = true;
            do {
              bVar12 = bVar14;
              lVar11 = 0;
              do {
                pTVar1 = (TSymbolTable *)puVar10[lVar5 * 0xe + lVar11];
                if (pTVar1 != (TSymbolTable *)0x0) {
                  glslang::TSymbolTable::~TSymbolTable(pTVar1);
                }
                operator_delete(pTVar1,0x28);
                puVar10[lVar5 * 0xe + lVar11] = 0;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0xe);
              lVar5 = 1;
              bVar14 = false;
            } while (bVar12);
            lVar13 = lVar13 + 1;
            puVar10 = puVar10 + 0x1c;
          } while (lVar13 != 4);
          lVar6 = lVar6 + 1;
          puVar9 = puVar9 + 0x70;
        } while (lVar6 != 4);
        lVar7 = lVar7 + 1;
        puVar4 = puVar4 + 0x1c0;
      } while (lVar7 != 0x11);
      lVar7 = 0;
      do {
        lVar6 = 0;
        do {
          lVar13 = 0;
          do {
            lVar5 = 0;
            bVar14 = true;
            do {
              bVar12 = bVar14;
              lVar5 = lVar5 * 0x10 + lVar13 * 0x20 + lVar6 * 0x80 + lVar7 * 0x200;
              lVar11 = 0;
              bVar14 = true;
              do {
                bVar8 = bVar14;
                pTVar1 = *(TSymbolTable **)
                          ((anonymous_namespace)::CommonSymbolTable + lVar11 * 8 + lVar5);
                if (pTVar1 != (TSymbolTable *)0x0) {
                  glslang::TSymbolTable::~TSymbolTable(pTVar1);
                }
                operator_delete(pTVar1,0x28);
                *(undefined8 *)((anonymous_namespace)::CommonSymbolTable + lVar11 * 8 + lVar5) = 0;
                pTVar2 = (anonymous_namespace)::PerProcessGPA;
                lVar11 = 1;
                bVar14 = false;
              } while (bVar8);
              lVar5 = 1;
              bVar14 = false;
            } while (bVar12);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x11);
      if ((anonymous_namespace)::PerProcessGPA != (TPoolAllocator *)0x0) {
        glslang::TPoolAllocator::~TPoolAllocator((anonymous_namespace)::PerProcessGPA);
        operator_delete(pTVar2,0x60);
        (anonymous_namespace)::PerProcessGPA = (TPoolAllocator *)0x0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::init_lock);
    return 1;
  }
  (anonymous_namespace)::NumberOfClients = iVar3;
  __assert_fail("NumberOfClients >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                ,0x574,"int ShFinalize()");
}

Assistant:

int ShFinalize()
{
#ifndef DISABLE_THREAD_SUPPORT
    const std::lock_guard<std::mutex> lock(init_lock);
#endif
    --NumberOfClients;
    assert(NumberOfClients >= 0);
    if (NumberOfClients > 0)
        return 1;

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int stage = 0; stage < EShLangCount; ++stage) {
                        delete SharedSymbolTables[version][spvVersion][p][source][stage];
                        SharedSymbolTables[version][spvVersion][p][source][stage] = nullptr;
                    }
                }
            }
        }
    }

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int pc = 0; pc < EPcCount; ++pc) {
                        delete CommonSymbolTable[version][spvVersion][p][source][pc];
                        CommonSymbolTable[version][spvVersion][p][source][pc] = nullptr;
                    }
                }
            }
        }
    }

    if (PerProcessGPA != nullptr) {
        delete PerProcessGPA;
        PerProcessGPA = nullptr;
    }

    return 1;
}